

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<4,_1,_true,_embree::avx::SubdivPatch1Intersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  ulong uVar4;
  RTCRayQueryContext *pRVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  uint uVar60;
  uint uVar61;
  uint uVar62;
  Geometry *pGVar63;
  long lVar64;
  undefined1 (*pauVar65) [16];
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  undefined1 (*pauVar71) [16];
  ulong uVar72;
  ulong uVar73;
  float fVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar79 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar98;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar99;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar97 [32];
  float fVar104;
  float fVar110;
  float fVar111;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar117 [16];
  float fVar124;
  float fVar125;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar126;
  float fVar132;
  float fVar133;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar130 [32];
  float fVar134;
  undefined1 auVar131 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  float fVar151;
  float fVar152;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar153 [16];
  float fVar163;
  float fVar165;
  float fVar167;
  undefined1 auVar154 [32];
  float fVar156;
  float fVar158;
  float fVar162;
  float fVar164;
  float fVar166;
  undefined1 auVar155 [64];
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar171 [32];
  float fVar175;
  float fVar177;
  float fVar179;
  float fVar181;
  float fVar183;
  float fVar185;
  undefined1 auVar172 [32];
  float fVar174;
  float fVar176;
  float fVar178;
  float fVar180;
  float fVar182;
  float fVar184;
  undefined1 auVar173 [64];
  float fVar186;
  float fVar187;
  undefined1 auVar188 [32];
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar189 [64];
  undefined1 auVar197 [64];
  float fVar198;
  undefined1 auVar199 [32];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar200 [64];
  float fVar207;
  float fVar208;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar209 [64];
  undefined1 auVar222 [64];
  MapUV<embree::avx::GridSOA::Gather3x3> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_144c;
  ulong local_1448;
  RayHit *local_1440;
  undefined1 (*local_1438) [16];
  ulong local_1430;
  ulong local_1428;
  undefined8 local_1420;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  long local_13f8;
  RTCFilterFunctionNArguments local_13f0;
  undefined1 local_13c0 [8];
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  float local_1360;
  undefined4 local_135c;
  undefined4 local_1358;
  float local_1354;
  float local_1350;
  uint local_134c;
  undefined4 local_1348;
  uint local_1344;
  uint local_1340;
  undefined1 local_1330 [16];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11c0 [12];
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 (**local_1160) [16];
  undefined1 local_1140 [32];
  float local_1120 [4];
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  float local_1100 [4];
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_fa0 == 8) {
    return;
  }
  pauVar71 = (undefined1 (*) [16])local_f90;
  uStack_f98 = 0;
  auVar147 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  auVar91 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
  aVar3 = (ray->super_RayK<1>).dir.field_0;
  auVar95._8_4_ = 0x7fffffff;
  auVar95._0_8_ = 0x7fffffff7fffffff;
  auVar95._12_4_ = 0x7fffffff;
  auVar95 = vandps_avx((undefined1  [16])aVar3,auVar95);
  auVar96._8_4_ = 0x219392ef;
  auVar96._0_8_ = 0x219392ef219392ef;
  auVar96._12_4_ = 0x219392ef;
  auVar95 = vcmpps_avx(auVar95,auVar96,1);
  auVar127._8_4_ = 0x3f800000;
  auVar127._0_8_ = 0x3f8000003f800000;
  auVar127._12_4_ = 0x3f800000;
  auVar96 = vdivps_avx(auVar127,(undefined1  [16])aVar3);
  auVar128._8_4_ = 0x5d5e0b6b;
  auVar128._0_8_ = 0x5d5e0b6b5d5e0b6b;
  auVar128._12_4_ = 0x5d5e0b6b;
  auVar95 = vblendvps_avx(auVar96,auVar128,auVar95);
  auVar117._0_4_ = auVar95._0_4_ * 0.99999964;
  auVar117._4_4_ = auVar95._4_4_ * 0.99999964;
  auVar117._8_4_ = auVar95._8_4_ * 0.99999964;
  auVar117._12_4_ = auVar95._12_4_ * 0.99999964;
  auVar153._0_4_ = auVar95._0_4_ * 1.0000004;
  auVar153._4_4_ = auVar95._4_4_ * 1.0000004;
  auVar153._8_4_ = auVar95._8_4_ * 1.0000004;
  auVar153._12_4_ = auVar95._12_4_ * 1.0000004;
  uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  local_11f0._4_4_ = uVar1;
  local_11f0._0_4_ = uVar1;
  local_11f0._8_4_ = uVar1;
  local_11f0._12_4_ = uVar1;
  auVar146 = ZEXT1664(local_11f0);
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  local_1200._4_4_ = uVar1;
  local_1200._0_4_ = uVar1;
  local_1200._8_4_ = uVar1;
  local_1200._12_4_ = uVar1;
  auVar150 = ZEXT1664(local_1200);
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  local_1210._4_4_ = uVar1;
  local_1210._0_4_ = uVar1;
  local_1210._8_4_ = uVar1;
  local_1210._12_4_ = uVar1;
  auVar155 = ZEXT1664(local_1210);
  local_1220 = vshufps_avx(auVar117,auVar117,0);
  auVar173 = ZEXT1664(local_1220);
  auVar95 = vmovshdup_avx(auVar117);
  local_1230 = vshufps_avx(auVar117,auVar117,0x55);
  auVar189 = ZEXT1664(local_1230);
  auVar96 = vshufpd_avx(auVar117,auVar117,1);
  local_1240 = vshufps_avx(auVar117,auVar117,0xaa);
  auVar197 = ZEXT1664(local_1240);
  local_1250 = vshufps_avx(auVar153,auVar153,0);
  auVar200 = ZEXT1664(local_1250);
  local_1260 = vshufps_avx(auVar153,auVar153,0x55);
  auVar209 = ZEXT1664(local_1260);
  uVar70 = (ulong)(auVar117._0_4_ < 0.0) << 4;
  local_1270 = vshufps_avx(auVar153,auVar153,0xaa);
  auVar222 = ZEXT1664(local_1270);
  uVar66 = (ulong)(auVar95._0_4_ < 0.0) << 4 | 0x20;
  uVar73 = (ulong)(auVar96._0_4_ < 0.0) << 4 | 0x40;
  uVar72 = uVar70 ^ 0x10;
  local_1330 = vshufps_avx(auVar147,auVar147,0);
  auVar140 = ZEXT1664(local_1330);
  local_11e0 = mm_lookupmask_pd._0_8_;
  uStack_11d8 = mm_lookupmask_pd._8_8_;
  uStack_11d0 = mm_lookupmask_pd._0_8_;
  uStack_11c8 = mm_lookupmask_pd._8_8_;
  auVar95 = vshufps_avx(auVar91,auVar91,0);
  auVar79 = ZEXT1664(auVar95);
  uVar69 = 0;
  local_1440 = ray;
  local_1448 = uVar70;
  do {
    local_13f8 = uVar69 + 0x30;
LAB_00b7f0d8:
    do {
      if (pauVar71 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar65 = pauVar71 + -1;
      pauVar71 = pauVar71 + -1;
    } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar65 + 8));
    uVar68 = *(ulong *)*pauVar71;
    while ((uVar68 & 8) == 0) {
      auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar70),auVar146._0_16_);
      auVar147._0_4_ = auVar173._0_4_ * auVar95._0_4_;
      auVar147._4_4_ = auVar173._4_4_ * auVar95._4_4_;
      auVar147._8_4_ = auVar173._8_4_ * auVar95._8_4_;
      auVar147._12_4_ = auVar173._12_4_ * auVar95._12_4_;
      auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar66),auVar150._0_16_);
      auVar91._0_4_ = auVar189._0_4_ * auVar95._0_4_;
      auVar91._4_4_ = auVar189._4_4_ * auVar95._4_4_;
      auVar91._8_4_ = auVar189._8_4_ * auVar95._8_4_;
      auVar91._12_4_ = auVar189._12_4_ * auVar95._12_4_;
      auVar95 = vmaxps_avx(auVar147,auVar91);
      auVar96 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar73),auVar155._0_16_);
      auVar92._0_4_ = auVar197._0_4_ * auVar96._0_4_;
      auVar92._4_4_ = auVar197._4_4_ * auVar96._4_4_;
      auVar92._8_4_ = auVar197._8_4_ * auVar96._8_4_;
      auVar92._12_4_ = auVar197._12_4_ * auVar96._12_4_;
      auVar96 = vmaxps_avx(auVar92,auVar140._0_16_);
      _local_11c0 = vmaxps_avx(auVar95,auVar96);
      auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar72),auVar146._0_16_);
      auVar93._0_4_ = auVar200._0_4_ * auVar95._0_4_;
      auVar93._4_4_ = auVar200._4_4_ * auVar95._4_4_;
      auVar93._8_4_ = auVar200._8_4_ * auVar95._8_4_;
      auVar93._12_4_ = auVar200._12_4_ * auVar95._12_4_;
      auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar66 ^ 0x10)),auVar150._0_16_);
      auVar105._0_4_ = auVar209._0_4_ * auVar95._0_4_;
      auVar105._4_4_ = auVar209._4_4_ * auVar95._4_4_;
      auVar105._8_4_ = auVar209._8_4_ * auVar95._8_4_;
      auVar105._12_4_ = auVar209._12_4_ * auVar95._12_4_;
      auVar95 = vminps_avx(auVar93,auVar105);
      auVar96 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar73 ^ 0x10)),auVar155._0_16_);
      auVar106._0_4_ = auVar222._0_4_ * auVar96._0_4_;
      auVar106._4_4_ = auVar222._4_4_ * auVar96._4_4_;
      auVar106._8_4_ = auVar222._8_4_ * auVar96._8_4_;
      auVar106._12_4_ = auVar222._12_4_ * auVar96._12_4_;
      auVar96 = vminps_avx(auVar106,auVar79._0_16_);
      auVar95 = vminps_avx(auVar95,auVar96);
      auVar95 = vcmpps_avx(_local_11c0,auVar95,2);
      uVar60 = vmovmskps_avx(auVar95);
      if (uVar60 == 0) goto LAB_00b7f0d8;
      uVar60 = uVar60 & 0xff;
      uVar67 = uVar68 & 0xfffffffffffffff0;
      lVar6 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      uVar68 = *(ulong *)(uVar67 + lVar6 * 8);
      uVar60 = uVar60 - 1 & uVar60;
      if (uVar60 != 0) {
        uVar61 = *(uint *)(local_11c0 + lVar6 * 4);
        lVar6 = 0;
        if (uVar60 != 0) {
          for (; (uVar60 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        uVar4 = *(ulong *)(uVar67 + lVar6 * 8);
        uVar62 = *(uint *)(local_11c0 + lVar6 * 4);
        uVar60 = uVar60 - 1 & uVar60;
        if (uVar60 == 0) {
          if (uVar61 < uVar62) {
            *(ulong *)*pauVar71 = uVar4;
            *(uint *)(*pauVar71 + 8) = uVar62;
            pauVar71 = pauVar71 + 1;
          }
          else {
            *(ulong *)*pauVar71 = uVar68;
            *(uint *)(*pauVar71 + 8) = uVar61;
            uVar68 = uVar4;
            pauVar71 = pauVar71 + 1;
          }
        }
        else {
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar68;
          auVar95 = vpunpcklqdq_avx(auVar86,ZEXT416(uVar61));
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar4;
          auVar96 = vpunpcklqdq_avx(auVar94,ZEXT416(uVar62));
          lVar6 = 0;
          if (uVar60 != 0) {
            for (; (uVar60 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          auVar107._8_8_ = 0;
          auVar107._0_8_ = *(ulong *)(uVar67 + lVar6 * 8);
          auVar91 = vpunpcklqdq_avx(auVar107,ZEXT416(*(uint *)(local_11c0 + lVar6 * 4)));
          auVar147 = vpcmpgtd_avx(auVar96,auVar95);
          uVar60 = uVar60 - 1 & uVar60;
          if (uVar60 == 0) {
            auVar153 = vpshufd_avx(auVar147,0xaa);
            auVar147 = vblendvps_avx(auVar96,auVar95,auVar153);
            auVar95 = vblendvps_avx(auVar95,auVar96,auVar153);
            auVar96 = vpcmpgtd_avx(auVar91,auVar147);
            auVar153 = vpshufd_avx(auVar96,0xaa);
            auVar96 = vblendvps_avx(auVar91,auVar147,auVar153);
            auVar147 = vblendvps_avx(auVar147,auVar91,auVar153);
            auVar91 = vpcmpgtd_avx(auVar147,auVar95);
            auVar153 = vpshufd_avx(auVar91,0xaa);
            auVar91 = vblendvps_avx(auVar147,auVar95,auVar153);
            auVar95 = vblendvps_avx(auVar95,auVar147,auVar153);
            *pauVar71 = auVar95;
            pauVar71[1] = auVar91;
            uVar68 = auVar96._0_8_;
            pauVar71 = pauVar71 + 2;
          }
          else {
            lVar6 = 0;
            if (uVar60 != 0) {
              for (; (uVar60 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            auVar129._8_8_ = 0;
            auVar129._0_8_ = *(ulong *)(uVar67 + lVar6 * 8);
            auVar117 = vpunpcklqdq_avx(auVar129,ZEXT416(*(uint *)(local_11c0 + lVar6 * 4)));
            auVar153 = vpshufd_avx(auVar147,0xaa);
            auVar147 = vblendvps_avx(auVar96,auVar95,auVar153);
            auVar95 = vblendvps_avx(auVar95,auVar96,auVar153);
            auVar96 = vpcmpgtd_avx(auVar117,auVar91);
            auVar153 = vpshufd_avx(auVar96,0xaa);
            auVar96 = vblendvps_avx(auVar117,auVar91,auVar153);
            auVar91 = vblendvps_avx(auVar91,auVar117,auVar153);
            auVar153 = vpcmpgtd_avx(auVar91,auVar95);
            auVar117 = vpshufd_avx(auVar153,0xaa);
            auVar153 = vblendvps_avx(auVar91,auVar95,auVar117);
            auVar95 = vblendvps_avx(auVar95,auVar91,auVar117);
            auVar91 = vpcmpgtd_avx(auVar96,auVar147);
            auVar117 = vpshufd_avx(auVar91,0xaa);
            auVar91 = vblendvps_avx(auVar96,auVar147,auVar117);
            auVar96 = vblendvps_avx(auVar147,auVar96,auVar117);
            auVar147 = vpcmpgtd_avx(auVar153,auVar96);
            auVar117 = vpshufd_avx(auVar147,0xaa);
            auVar147 = vblendvps_avx(auVar153,auVar96,auVar117);
            auVar96 = vblendvps_avx(auVar96,auVar153,auVar117);
            *pauVar71 = auVar95;
            pauVar71[1] = auVar96;
            pauVar71[2] = auVar147;
            auVar140 = ZEXT1664(local_1330);
            uVar68 = auVar91._0_8_;
            pauVar71 = pauVar71 + 3;
          }
        }
      }
    }
    if (((uint)uVar68 & 0xf) == 8) {
      uVar60 = *(uint *)(uVar69 + 0xc);
      local_1430 = (ulong)uVar60;
      uVar61 = *(uint *)(uVar69 + 0x10);
      local_1428 = (ulong)uVar61;
      lVar64 = (ulong)*(uint *)(uVar69 + 0x24) + local_13f8;
      uVar68 = uVar68 >> 4;
      lVar6 = lVar64 + uVar68 * 4;
      auVar95 = *(undefined1 (*) [16])(lVar6 + -4 + local_1430 * 4);
      auVar96 = auVar95;
      if (2 < local_1428) {
        auVar96 = *(undefined1 (*) [16])(lVar64 + uVar68 * 4 + -4 + local_1430 * 8);
      }
      auVar147 = *(undefined1 (*) [16])(lVar64 + -4 + uVar68 * 4);
      if (local_1430 == 2) {
        auVar147 = vshufps_avx(auVar147,auVar147,0x54);
        auVar95 = vshufps_avx(auVar95,auVar95,0x54);
        auVar96 = vshufps_avx(auVar96,auVar96,0x54);
      }
      uVar68 = (ulong)*(uint *)(uVar69 + 0x14);
      pauVar65 = (undefined1 (*) [16])(lVar6 + uVar68 * 4 + -4);
      auVar91 = *(undefined1 (*) [16])(*pauVar65 + local_1430 * 4);
      auVar153 = auVar91;
      if (2 < uVar61) {
        auVar153 = *(undefined1 (*) [16])(*pauVar65 + local_1430 * 8);
      }
      auVar117 = *pauVar65;
      if (uVar60 == 2) {
        auVar117 = vshufps_avx(auVar117,auVar117,0x54);
        auVar91 = vshufps_avx(auVar91,auVar91,0x54);
        auVar153 = vshufps_avx(auVar153,auVar153,0x54);
      }
      pauVar65 = (undefined1 (*) [16])(lVar6 + uVar68 * 8 + -4);
      auVar127 = *(undefined1 (*) [16])(*pauVar65 + local_1430 * 4);
      auVar128 = auVar127;
      if (2 < uVar61) {
        auVar128 = *(undefined1 (*) [16])(*pauVar65 + local_1430 * 8);
      }
      auVar148._16_16_ = auVar95;
      auVar148._0_16_ = auVar147;
      auVar75._16_16_ = auVar96;
      auVar75._0_16_ = auVar95;
      auVar26 = vunpcklps_avx(auVar148,auVar75);
      auVar148 = vshufps_avx(auVar148,auVar148,0xa5);
      auVar75 = vshufps_avx(auVar75,auVar75,0x94);
      auVar141._16_16_ = auVar91;
      auVar141._0_16_ = auVar117;
      auVar118._16_16_ = auVar153;
      auVar118._0_16_ = auVar91;
      auVar27 = vunpcklps_avx(auVar141,auVar118);
      auVar141 = vshufps_avx(auVar141,auVar141,0xa5);
      auVar118 = vshufps_avx(auVar118,auVar118,0x94);
      auVar95 = *pauVar65;
      if (uVar60 == 2) {
        auVar95 = vshufps_avx(auVar95,auVar95,0x54);
        auVar127 = vshufps_avx(auVar127,auVar127,0x54);
        auVar128 = vshufps_avx(auVar128,auVar128,0x54);
      }
      auVar119._16_16_ = auVar127;
      auVar119._0_16_ = auVar95;
      auVar130._16_16_ = auVar128;
      auVar130._0_16_ = auVar127;
      auVar28 = vunpcklps_avx(auVar119,auVar130);
      auVar23 = vshufps_avx(auVar119,auVar119,0xa5);
      uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      auVar171._4_4_ = uVar1;
      auVar171._0_4_ = uVar1;
      auVar171._8_4_ = uVar1;
      auVar171._12_4_ = uVar1;
      auVar171._16_4_ = uVar1;
      auVar171._20_4_ = uVar1;
      auVar171._24_4_ = uVar1;
      auVar171._28_4_ = uVar1;
      uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      auVar188._4_4_ = uVar1;
      auVar188._0_4_ = uVar1;
      auVar188._8_4_ = uVar1;
      auVar188._12_4_ = uVar1;
      auVar188._16_4_ = uVar1;
      auVar188._20_4_ = uVar1;
      auVar188._24_4_ = uVar1;
      auVar188._28_4_ = uVar1;
      auVar24 = vshufps_avx(auVar130,auVar130,0x94);
      uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      auVar199._4_4_ = uVar2;
      auVar199._0_4_ = uVar2;
      auVar199._8_4_ = uVar2;
      auVar199._12_4_ = uVar2;
      auVar199._16_4_ = uVar2;
      auVar199._20_4_ = uVar2;
      auVar199._24_4_ = uVar2;
      auVar199._28_4_ = uVar2;
      local_12c0 = vsubps_avx(auVar26,auVar171);
      local_12e0 = vsubps_avx(auVar27,auVar188);
      local_1300 = vsubps_avx(auVar28,auVar199);
      auVar148 = vsubps_avx(auVar148,auVar171);
      auVar141 = vsubps_avx(auVar141,auVar188);
      auVar26 = vsubps_avx(auVar23,auVar199);
      auVar75 = vsubps_avx(auVar75,auVar171);
      auVar118 = vsubps_avx(auVar118,auVar188);
      auVar27 = vsubps_avx(auVar24,auVar199);
      local_1320 = vsubps_avx(auVar75,local_12c0);
      local_fc0 = vsubps_avx(auVar118,local_12e0);
      local_fe0 = vsubps_avx(auVar27,local_1300);
      fVar7 = local_12e0._0_4_;
      fVar74 = auVar118._0_4_ + fVar7;
      fVar10 = local_12e0._4_4_;
      fVar80 = auVar118._4_4_ + fVar10;
      fVar98 = local_12e0._8_4_;
      fVar81 = auVar118._8_4_ + fVar98;
      fVar101 = local_12e0._12_4_;
      fVar82 = auVar118._12_4_ + fVar101;
      fVar14 = local_12e0._16_4_;
      fVar83 = auVar118._16_4_ + fVar14;
      fVar17 = local_12e0._20_4_;
      fVar84 = auVar118._20_4_ + fVar17;
      fVar20 = local_12e0._24_4_;
      fVar85 = auVar118._24_4_ + fVar20;
      fVar8 = local_1300._0_4_;
      fVar151 = auVar27._0_4_ + fVar8;
      fVar11 = local_1300._4_4_;
      fVar156 = auVar27._4_4_ + fVar11;
      fVar99 = local_1300._8_4_;
      fVar158 = auVar27._8_4_ + fVar99;
      fVar103 = local_1300._12_4_;
      fVar160 = auVar27._12_4_ + fVar103;
      fVar15 = local_1300._16_4_;
      fVar162 = auVar27._16_4_ + fVar15;
      fVar18 = local_1300._20_4_;
      fVar164 = auVar27._20_4_ + fVar18;
      fVar21 = local_1300._24_4_;
      fVar166 = auVar27._24_4_ + fVar21;
      fVar169 = local_1300._28_4_;
      fVar126 = local_fe0._0_4_;
      fVar132 = local_fe0._4_4_;
      auVar23._4_4_ = fVar132 * fVar80;
      auVar23._0_4_ = fVar126 * fVar74;
      fVar133 = local_fe0._8_4_;
      auVar23._8_4_ = fVar133 * fVar81;
      fVar134 = local_fe0._12_4_;
      auVar23._12_4_ = fVar134 * fVar82;
      fVar135 = local_fe0._16_4_;
      auVar23._16_4_ = fVar135 * fVar83;
      fVar136 = local_fe0._20_4_;
      auVar23._20_4_ = fVar136 * fVar84;
      fVar137 = local_fe0._24_4_;
      auVar23._24_4_ = fVar137 * fVar85;
      auVar23._28_4_ = uVar1;
      fVar207 = local_fc0._0_4_;
      fVar210 = local_fc0._4_4_;
      auVar28._4_4_ = fVar210 * fVar156;
      auVar28._0_4_ = fVar207 * fVar151;
      fVar212 = local_fc0._8_4_;
      auVar28._8_4_ = fVar212 * fVar158;
      fVar214 = local_fc0._12_4_;
      auVar28._12_4_ = fVar214 * fVar160;
      fVar216 = local_fc0._16_4_;
      auVar28._16_4_ = fVar216 * fVar162;
      fVar218 = local_fc0._20_4_;
      auVar28._20_4_ = fVar218 * fVar164;
      fVar220 = local_fc0._24_4_;
      auVar28._24_4_ = fVar220 * fVar166;
      auVar28._28_4_ = auVar24._28_4_;
      auVar23 = vsubps_avx(auVar28,auVar23);
      fVar9 = local_12c0._0_4_;
      fVar186 = auVar75._0_4_ + fVar9;
      fVar12 = local_12c0._4_4_;
      fVar190 = auVar75._4_4_ + fVar12;
      fVar100 = local_12c0._8_4_;
      fVar192 = auVar75._8_4_ + fVar100;
      fVar13 = local_12c0._12_4_;
      fVar193 = auVar75._12_4_ + fVar13;
      fVar16 = local_12c0._16_4_;
      fVar194 = auVar75._16_4_ + fVar16;
      fVar19 = local_12c0._20_4_;
      fVar195 = auVar75._20_4_ + fVar19;
      fVar22 = local_12c0._24_4_;
      fVar196 = auVar75._24_4_ + fVar22;
      fVar168 = local_1320._0_4_;
      fVar174 = local_1320._4_4_;
      auVar25._4_4_ = fVar174 * fVar156;
      auVar25._0_4_ = fVar168 * fVar151;
      fVar176 = local_1320._8_4_;
      auVar25._8_4_ = fVar176 * fVar158;
      fVar178 = local_1320._12_4_;
      auVar25._12_4_ = fVar178 * fVar160;
      fVar180 = local_1320._16_4_;
      auVar25._16_4_ = fVar180 * fVar162;
      fVar182 = local_1320._20_4_;
      auVar25._20_4_ = fVar182 * fVar164;
      fVar184 = local_1320._24_4_;
      auVar25._24_4_ = fVar184 * fVar166;
      auVar25._28_4_ = auVar27._28_4_ + fVar169;
      auVar29._4_4_ = fVar190 * fVar132;
      auVar29._0_4_ = fVar186 * fVar126;
      auVar29._8_4_ = fVar192 * fVar133;
      auVar29._12_4_ = fVar193 * fVar134;
      auVar29._16_4_ = fVar194 * fVar135;
      auVar29._20_4_ = fVar195 * fVar136;
      auVar29._24_4_ = fVar196 * fVar137;
      auVar29._28_4_ = auVar24._28_4_;
      auVar24 = vsubps_avx(auVar29,auVar25);
      auVar30._4_4_ = fVar210 * fVar190;
      auVar30._0_4_ = fVar207 * fVar186;
      auVar30._8_4_ = fVar212 * fVar192;
      auVar30._12_4_ = fVar214 * fVar193;
      auVar30._16_4_ = fVar216 * fVar194;
      auVar30._20_4_ = fVar218 * fVar195;
      auVar30._24_4_ = fVar220 * fVar196;
      auVar30._28_4_ = auVar75._28_4_ + local_12c0._28_4_;
      auVar31._4_4_ = fVar174 * fVar80;
      auVar31._0_4_ = fVar168 * fVar74;
      auVar31._8_4_ = fVar176 * fVar81;
      auVar31._12_4_ = fVar178 * fVar82;
      auVar31._16_4_ = fVar180 * fVar83;
      auVar31._20_4_ = fVar182 * fVar84;
      auVar31._24_4_ = fVar184 * fVar85;
      auVar31._28_4_ = auVar118._28_4_ + local_12e0._28_4_;
      fVar74 = (ray->super_RayK<1>).dir.field_0.m128[2];
      local_13a0._4_4_ = fVar74;
      local_13a0._0_4_ = fVar74;
      local_13a0._8_4_ = fVar74;
      local_13a0._12_4_ = fVar74;
      local_13a0._16_4_ = fVar74;
      local_13a0._20_4_ = fVar74;
      local_13a0._24_4_ = fVar74;
      local_13a0._28_4_ = fVar74;
      auVar28 = vsubps_avx(auVar31,auVar30);
      local_13c0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
      local_1420._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
      fVar187 = local_1420._4_4_ * auVar23._0_4_ +
                (float)local_13c0._4_4_ * auVar24._0_4_ + fVar74 * auVar28._0_4_;
      fVar191 = local_1420._4_4_ * auVar23._4_4_ +
                (float)local_13c0._4_4_ * auVar24._4_4_ + fVar74 * auVar28._4_4_;
      local_1380._0_8_ = CONCAT44(fVar191,fVar187);
      local_1380._8_4_ =
           local_1420._4_4_ * auVar23._8_4_ +
           (float)local_13c0._4_4_ * auVar24._8_4_ + fVar74 * auVar28._8_4_;
      local_1380._12_4_ =
           local_1420._4_4_ * auVar23._12_4_ +
           (float)local_13c0._4_4_ * auVar24._12_4_ + fVar74 * auVar28._12_4_;
      local_1380._16_4_ =
           local_1420._4_4_ * auVar23._16_4_ +
           (float)local_13c0._4_4_ * auVar24._16_4_ + fVar74 * auVar28._16_4_;
      local_1380._20_4_ =
           local_1420._4_4_ * auVar23._20_4_ +
           (float)local_13c0._4_4_ * auVar24._20_4_ + fVar74 * auVar28._20_4_;
      local_1380._24_4_ =
           local_1420._4_4_ * auVar23._24_4_ +
           (float)local_13c0._4_4_ * auVar24._24_4_ + fVar74 * auVar28._24_4_;
      local_1380._28_4_ = auVar23._28_4_ + auVar24._28_4_ + auVar28._28_4_;
      local_1000 = vsubps_avx(local_12e0,auVar141);
      local_1020 = vsubps_avx(local_1300,auVar26);
      fVar82 = fVar7 + auVar141._0_4_;
      fVar83 = fVar10 + auVar141._4_4_;
      fVar84 = fVar98 + auVar141._8_4_;
      fVar85 = fVar101 + auVar141._12_4_;
      fVar151 = fVar14 + auVar141._16_4_;
      fVar156 = fVar17 + auVar141._20_4_;
      fVar158 = fVar20 + auVar141._24_4_;
      fVar80 = auVar141._28_4_;
      fVar160 = fVar8 + auVar26._0_4_;
      fVar162 = fVar11 + auVar26._4_4_;
      fVar164 = fVar99 + auVar26._8_4_;
      fVar166 = fVar103 + auVar26._12_4_;
      fVar186 = fVar15 + auVar26._16_4_;
      fVar190 = fVar18 + auVar26._20_4_;
      fVar192 = fVar21 + auVar26._24_4_;
      fVar81 = auVar26._28_4_;
      fVar152 = local_1020._0_4_;
      fVar157 = local_1020._4_4_;
      auVar24._4_4_ = fVar157 * fVar83;
      auVar24._0_4_ = fVar152 * fVar82;
      fVar159 = local_1020._8_4_;
      auVar24._8_4_ = fVar159 * fVar84;
      fVar161 = local_1020._12_4_;
      auVar24._12_4_ = fVar161 * fVar85;
      fVar163 = local_1020._16_4_;
      auVar24._16_4_ = fVar163 * fVar151;
      fVar165 = local_1020._20_4_;
      auVar24._20_4_ = fVar165 * fVar156;
      fVar167 = local_1020._24_4_;
      auVar24._24_4_ = fVar167 * fVar158;
      auVar24._28_4_ = local_fc0._28_4_;
      fVar198 = local_1000._0_4_;
      fVar201 = local_1000._4_4_;
      auVar32._4_4_ = fVar201 * fVar162;
      auVar32._0_4_ = fVar198 * fVar160;
      fVar202 = local_1000._8_4_;
      auVar32._8_4_ = fVar202 * fVar164;
      fVar203 = local_1000._12_4_;
      auVar32._12_4_ = fVar203 * fVar166;
      fVar204 = local_1000._16_4_;
      auVar32._16_4_ = fVar204 * fVar186;
      fVar205 = local_1000._20_4_;
      auVar32._20_4_ = fVar205 * fVar190;
      fVar206 = local_1000._24_4_;
      auVar32._24_4_ = fVar206 * fVar192;
      auVar32._28_4_ = fVar169;
      auVar23 = vsubps_avx(auVar32,auVar24);
      auVar24 = vsubps_avx(local_12c0,auVar148);
      fVar208 = auVar24._0_4_;
      fVar211 = auVar24._4_4_;
      auVar33._4_4_ = fVar211 * fVar162;
      auVar33._0_4_ = fVar208 * fVar160;
      fVar213 = auVar24._8_4_;
      auVar33._8_4_ = fVar213 * fVar164;
      fVar215 = auVar24._12_4_;
      auVar33._12_4_ = fVar215 * fVar166;
      fVar217 = auVar24._16_4_;
      auVar33._16_4_ = fVar217 * fVar186;
      fVar219 = auVar24._20_4_;
      auVar33._20_4_ = fVar219 * fVar190;
      fVar221 = auVar24._24_4_;
      auVar33._24_4_ = fVar221 * fVar192;
      auVar33._28_4_ = fVar169 + fVar81;
      fVar169 = fVar9 + auVar148._0_4_;
      fVar160 = fVar12 + auVar148._4_4_;
      fVar162 = fVar100 + auVar148._8_4_;
      fVar164 = fVar13 + auVar148._12_4_;
      fVar166 = fVar16 + auVar148._16_4_;
      fVar186 = fVar19 + auVar148._20_4_;
      fVar190 = fVar22 + auVar148._24_4_;
      auVar34._4_4_ = fVar157 * fVar160;
      auVar34._0_4_ = fVar152 * fVar169;
      auVar34._8_4_ = fVar159 * fVar162;
      auVar34._12_4_ = fVar161 * fVar164;
      auVar34._16_4_ = fVar163 * fVar166;
      auVar34._20_4_ = fVar165 * fVar186;
      auVar34._24_4_ = fVar167 * fVar190;
      auVar34._28_4_ = local_1020._28_4_;
      auVar24 = vsubps_avx(auVar34,auVar33);
      auVar35._4_4_ = fVar201 * fVar160;
      auVar35._0_4_ = fVar198 * fVar169;
      auVar35._8_4_ = fVar202 * fVar162;
      auVar35._12_4_ = fVar203 * fVar164;
      auVar35._16_4_ = fVar204 * fVar166;
      auVar35._20_4_ = fVar205 * fVar186;
      auVar35._24_4_ = fVar206 * fVar190;
      auVar35._28_4_ = local_1020._28_4_;
      auVar36._4_4_ = fVar211 * fVar83;
      auVar36._0_4_ = fVar208 * fVar82;
      auVar36._8_4_ = fVar213 * fVar84;
      auVar36._12_4_ = fVar215 * fVar85;
      auVar36._16_4_ = fVar217 * fVar151;
      auVar36._20_4_ = fVar219 * fVar156;
      auVar36._24_4_ = fVar221 * fVar158;
      auVar36._28_4_ = local_12e0._28_4_ + fVar80;
      auVar28 = vsubps_avx(auVar36,auVar35);
      local_11a0._0_4_ =
           local_1420._4_4_ * auVar23._0_4_ +
           (float)local_13c0._4_4_ * auVar24._0_4_ + fVar74 * auVar28._0_4_;
      local_11a0._4_4_ =
           local_1420._4_4_ * auVar23._4_4_ +
           (float)local_13c0._4_4_ * auVar24._4_4_ + fVar74 * auVar28._4_4_;
      local_11a0._8_4_ =
           local_1420._4_4_ * auVar23._8_4_ +
           (float)local_13c0._4_4_ * auVar24._8_4_ + fVar74 * auVar28._8_4_;
      local_11a0._12_4_ =
           local_1420._4_4_ * auVar23._12_4_ +
           (float)local_13c0._4_4_ * auVar24._12_4_ + fVar74 * auVar28._12_4_;
      local_11a0._16_4_ =
           local_1420._4_4_ * auVar23._16_4_ +
           (float)local_13c0._4_4_ * auVar24._16_4_ + fVar74 * auVar28._16_4_;
      local_11a0._20_4_ =
           local_1420._4_4_ * auVar23._20_4_ +
           (float)local_13c0._4_4_ * auVar24._20_4_ + fVar74 * auVar28._20_4_;
      local_11a0._24_4_ =
           local_1420._4_4_ * auVar23._24_4_ +
           (float)local_13c0._4_4_ * auVar24._24_4_ + fVar74 * auVar28._24_4_;
      local_11a0._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar28._28_4_;
      auVar23 = vsubps_avx(auVar148,auVar75);
      fVar190 = auVar75._0_4_ + auVar148._0_4_;
      fVar192 = auVar75._4_4_ + auVar148._4_4_;
      fVar193 = auVar75._8_4_ + auVar148._8_4_;
      fVar194 = auVar75._12_4_ + auVar148._12_4_;
      fVar195 = auVar75._16_4_ + auVar148._16_4_;
      fVar196 = auVar75._20_4_ + auVar148._20_4_;
      fVar102 = auVar75._24_4_ + auVar148._24_4_;
      auVar24 = vsubps_avx(auVar141,auVar118);
      fVar104 = auVar141._0_4_ + auVar118._0_4_;
      fVar110 = auVar141._4_4_ + auVar118._4_4_;
      fVar111 = auVar141._8_4_ + auVar118._8_4_;
      fVar112 = auVar141._12_4_ + auVar118._12_4_;
      fVar113 = auVar141._16_4_ + auVar118._16_4_;
      fVar114 = auVar141._20_4_ + auVar118._20_4_;
      fVar115 = auVar141._24_4_ + auVar118._24_4_;
      fVar116 = fVar80 + auVar118._28_4_;
      auVar118 = vsubps_avx(auVar26,auVar27);
      fVar82 = auVar26._0_4_ + auVar27._0_4_;
      fVar83 = auVar26._4_4_ + auVar27._4_4_;
      fVar84 = auVar26._8_4_ + auVar27._8_4_;
      fVar85 = auVar26._12_4_ + auVar27._12_4_;
      fVar151 = auVar26._16_4_ + auVar27._16_4_;
      fVar124 = auVar26._20_4_ + auVar27._20_4_;
      fVar125 = auVar26._24_4_ + auVar27._24_4_;
      fVar156 = auVar118._0_4_;
      fVar158 = auVar118._4_4_;
      auVar37._4_4_ = fVar158 * fVar110;
      auVar37._0_4_ = fVar156 * fVar104;
      fVar160 = auVar118._8_4_;
      auVar37._8_4_ = fVar160 * fVar111;
      fVar162 = auVar118._12_4_;
      auVar37._12_4_ = fVar162 * fVar112;
      fVar164 = auVar118._16_4_;
      auVar37._16_4_ = fVar164 * fVar113;
      fVar166 = auVar118._20_4_;
      auVar37._20_4_ = fVar166 * fVar114;
      fVar186 = auVar118._24_4_;
      auVar37._24_4_ = fVar186 * fVar115;
      auVar37._28_4_ = fVar80;
      fVar170 = auVar24._0_4_;
      fVar175 = auVar24._4_4_;
      auVar38._4_4_ = fVar175 * fVar83;
      auVar38._0_4_ = fVar170 * fVar82;
      fVar177 = auVar24._8_4_;
      auVar38._8_4_ = fVar177 * fVar84;
      fVar179 = auVar24._12_4_;
      auVar38._12_4_ = fVar179 * fVar85;
      fVar181 = auVar24._16_4_;
      auVar38._16_4_ = fVar181 * fVar151;
      fVar183 = auVar24._20_4_;
      auVar38._20_4_ = fVar183 * fVar124;
      fVar185 = auVar24._24_4_;
      auVar38._24_4_ = fVar185 * fVar125;
      auVar38._28_4_ = fVar81;
      auVar141 = vsubps_avx(auVar38,auVar37);
      fVar169 = auVar23._0_4_;
      fVar80 = auVar23._4_4_;
      auVar39._4_4_ = fVar80 * fVar83;
      auVar39._0_4_ = fVar169 * fVar82;
      fVar82 = auVar23._8_4_;
      auVar39._8_4_ = fVar82 * fVar84;
      fVar83 = auVar23._12_4_;
      auVar39._12_4_ = fVar83 * fVar85;
      fVar84 = auVar23._16_4_;
      auVar39._16_4_ = fVar84 * fVar151;
      fVar85 = auVar23._20_4_;
      auVar39._20_4_ = fVar85 * fVar124;
      fVar151 = auVar23._24_4_;
      auVar39._24_4_ = fVar151 * fVar125;
      auVar39._28_4_ = fVar81 + auVar27._28_4_;
      auVar27._4_4_ = fVar158 * fVar192;
      auVar27._0_4_ = fVar156 * fVar190;
      auVar27._8_4_ = fVar160 * fVar193;
      auVar27._12_4_ = fVar162 * fVar194;
      auVar27._16_4_ = fVar164 * fVar195;
      auVar27._20_4_ = fVar166 * fVar196;
      auVar27._24_4_ = fVar186 * fVar102;
      auVar27._28_4_ = fVar81;
      auVar26 = vsubps_avx(auVar27,auVar39);
      auVar40._4_4_ = fVar175 * fVar192;
      auVar40._0_4_ = fVar170 * fVar190;
      auVar40._8_4_ = fVar177 * fVar193;
      auVar40._12_4_ = fVar179 * fVar194;
      auVar40._16_4_ = fVar181 * fVar195;
      auVar40._20_4_ = fVar183 * fVar196;
      auVar40._24_4_ = fVar185 * fVar102;
      auVar40._28_4_ = auVar75._28_4_ + auVar148._28_4_;
      auVar41._4_4_ = fVar80 * fVar110;
      auVar41._0_4_ = fVar169 * fVar104;
      auVar41._8_4_ = fVar82 * fVar111;
      auVar41._12_4_ = fVar83 * fVar112;
      auVar41._16_4_ = fVar84 * fVar113;
      auVar41._20_4_ = fVar85 * fVar114;
      auVar41._24_4_ = fVar151 * fVar115;
      auVar41._28_4_ = fVar116;
      auVar148 = vsubps_avx(auVar41,auVar40);
      local_13c0._0_4_ = local_13c0._4_4_;
      fStack_13b8 = (float)local_13c0._4_4_;
      fStack_13b4 = (float)local_13c0._4_4_;
      fStack_13b0 = (float)local_13c0._4_4_;
      fStack_13ac = (float)local_13c0._4_4_;
      fStack_13a8 = (float)local_13c0._4_4_;
      fStack_13a4 = (float)local_13c0._4_4_;
      local_1420._0_4_ = local_1420._4_4_;
      fStack_1418 = local_1420._4_4_;
      fStack_1414 = local_1420._4_4_;
      fStack_1410 = local_1420._4_4_;
      fStack_140c = local_1420._4_4_;
      fStack_1408 = local_1420._4_4_;
      fStack_1404 = local_1420._4_4_;
      auVar97._0_4_ =
           local_1420._4_4_ * auVar141._0_4_ +
           (float)local_13c0._4_4_ * auVar26._0_4_ + fVar74 * auVar148._0_4_;
      auVar97._4_4_ =
           local_1420._4_4_ * auVar141._4_4_ +
           (float)local_13c0._4_4_ * auVar26._4_4_ + fVar74 * auVar148._4_4_;
      auVar97._8_4_ =
           local_1420._4_4_ * auVar141._8_4_ +
           (float)local_13c0._4_4_ * auVar26._8_4_ + fVar74 * auVar148._8_4_;
      auVar97._12_4_ =
           local_1420._4_4_ * auVar141._12_4_ +
           (float)local_13c0._4_4_ * auVar26._12_4_ + fVar74 * auVar148._12_4_;
      auVar97._16_4_ =
           local_1420._4_4_ * auVar141._16_4_ +
           (float)local_13c0._4_4_ * auVar26._16_4_ + fVar74 * auVar148._16_4_;
      auVar97._20_4_ =
           local_1420._4_4_ * auVar141._20_4_ +
           (float)local_13c0._4_4_ * auVar26._20_4_ + fVar74 * auVar148._20_4_;
      auVar97._24_4_ =
           local_1420._4_4_ * auVar141._24_4_ +
           (float)local_13c0._4_4_ * auVar26._24_4_ + fVar74 * auVar148._24_4_;
      auVar97._28_4_ = fVar116 + fVar116 + auVar148._28_4_;
      local_1180._0_4_ = auVar97._0_4_ + fVar187 + local_11a0._0_4_;
      local_1180._4_4_ = auVar97._4_4_ + fVar191 + local_11a0._4_4_;
      local_1180._8_4_ = auVar97._8_4_ + local_1380._8_4_ + local_11a0._8_4_;
      local_1180._12_4_ = auVar97._12_4_ + local_1380._12_4_ + local_11a0._12_4_;
      local_1180._16_4_ = auVar97._16_4_ + local_1380._16_4_ + local_11a0._16_4_;
      local_1180._20_4_ = auVar97._20_4_ + local_1380._20_4_ + local_11a0._20_4_;
      local_1180._24_4_ = auVar97._24_4_ + local_1380._24_4_ + local_11a0._24_4_;
      local_1180._28_4_ = auVar97._28_4_ + local_1380._28_4_ + local_11a0._28_4_;
      auVar148 = vminps_avx(local_1380,local_11a0);
      auVar148 = vminps_avx(auVar148,auVar97);
      auVar120._8_4_ = 0x7fffffff;
      auVar120._0_8_ = 0x7fffffff7fffffff;
      auVar120._12_4_ = 0x7fffffff;
      auVar120._16_4_ = 0x7fffffff;
      auVar120._20_4_ = 0x7fffffff;
      auVar120._24_4_ = 0x7fffffff;
      auVar120._28_4_ = 0x7fffffff;
      local_1060 = vandps_avx(local_1180,auVar120);
      fVar81 = local_1060._0_4_ * 1.1920929e-07;
      fVar190 = local_1060._4_4_ * 1.1920929e-07;
      auVar42._4_4_ = fVar190;
      auVar42._0_4_ = fVar81;
      fVar192 = local_1060._8_4_ * 1.1920929e-07;
      auVar42._8_4_ = fVar192;
      fVar193 = local_1060._12_4_ * 1.1920929e-07;
      auVar42._12_4_ = fVar193;
      fVar194 = local_1060._16_4_ * 1.1920929e-07;
      auVar42._16_4_ = fVar194;
      fVar195 = local_1060._20_4_ * 1.1920929e-07;
      auVar42._20_4_ = fVar195;
      fVar196 = local_1060._24_4_ * 1.1920929e-07;
      auVar42._24_4_ = fVar196;
      auVar42._28_4_ = 0x34000000;
      auVar138._0_8_ = CONCAT44(fVar190,fVar81) ^ 0x8000000080000000;
      auVar138._8_4_ = -fVar192;
      auVar138._12_4_ = -fVar193;
      auVar138._16_4_ = -fVar194;
      auVar138._20_4_ = -fVar195;
      auVar138._24_4_ = -fVar196;
      auVar138._28_4_ = 0xb4000000;
      auVar148 = vcmpps_avx(auVar148,auVar138,5);
      auVar141 = vmaxps_avx(local_1380,local_11a0);
      auVar75 = vmaxps_avx(auVar141,auVar97);
      auVar75 = vcmpps_avx(auVar75,auVar42,2);
      local_1040 = vorps_avx(auVar148,auVar75);
      local_1438 = (undefined1 (*) [16])(lVar6 + uVar68 * 0xc + -4);
      auVar26._8_8_ = uStack_11d8;
      auVar26._0_8_ = local_11e0;
      auVar26._16_8_ = uStack_11d0;
      auVar26._24_8_ = uStack_11c8;
      auVar26 = auVar26 & local_1040;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0x7f,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0xbf,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar26[0x1f] < '\0') {
        auVar43._4_4_ = fVar201 * fVar132;
        auVar43._0_4_ = fVar198 * fVar126;
        auVar43._8_4_ = fVar202 * fVar133;
        auVar43._12_4_ = fVar203 * fVar134;
        auVar43._16_4_ = fVar204 * fVar135;
        auVar43._20_4_ = fVar205 * fVar136;
        auVar43._24_4_ = fVar206 * fVar137;
        auVar43._28_4_ = local_1040._28_4_;
        auVar44._4_4_ = fVar210 * fVar157;
        auVar44._0_4_ = fVar207 * fVar152;
        auVar44._8_4_ = fVar212 * fVar159;
        auVar44._12_4_ = fVar214 * fVar161;
        auVar44._16_4_ = fVar216 * fVar163;
        auVar44._20_4_ = fVar218 * fVar165;
        auVar44._24_4_ = fVar220 * fVar167;
        auVar44._28_4_ = auVar148._28_4_;
        auVar26 = vsubps_avx(auVar44,auVar43);
        auVar45._4_4_ = fVar157 * fVar175;
        auVar45._0_4_ = fVar152 * fVar170;
        auVar45._8_4_ = fVar159 * fVar177;
        auVar45._12_4_ = fVar161 * fVar179;
        auVar45._16_4_ = fVar163 * fVar181;
        auVar45._20_4_ = fVar165 * fVar183;
        auVar45._24_4_ = fVar167 * fVar185;
        auVar45._28_4_ = 0x34000000;
        auVar46._4_4_ = fVar201 * fVar158;
        auVar46._0_4_ = fVar198 * fVar156;
        auVar46._8_4_ = fVar202 * fVar160;
        auVar46._12_4_ = fVar203 * fVar162;
        auVar46._16_4_ = fVar204 * fVar164;
        auVar46._20_4_ = fVar205 * fVar166;
        auVar46._24_4_ = fVar206 * fVar186;
        auVar46._28_4_ = auVar141._28_4_;
        auVar141 = vsubps_avx(auVar46,auVar45);
        auVar142._8_4_ = 0x7fffffff;
        auVar142._0_8_ = 0x7fffffff7fffffff;
        auVar142._12_4_ = 0x7fffffff;
        auVar142._16_4_ = 0x7fffffff;
        auVar142._20_4_ = 0x7fffffff;
        auVar142._24_4_ = 0x7fffffff;
        auVar142._28_4_ = 0x7fffffff;
        auVar148 = vandps_avx(auVar43,auVar142);
        auVar75 = vandps_avx(auVar45,auVar142);
        auVar148 = vcmpps_avx(auVar148,auVar75,1);
        local_10c0 = vblendvps_avx(auVar141,auVar26,auVar148);
        auVar47._4_4_ = fVar211 * fVar158;
        auVar47._0_4_ = fVar208 * fVar156;
        auVar47._8_4_ = fVar213 * fVar160;
        auVar47._12_4_ = fVar215 * fVar162;
        auVar47._16_4_ = fVar217 * fVar164;
        auVar47._20_4_ = fVar219 * fVar166;
        auVar47._24_4_ = fVar221 * fVar186;
        auVar47._28_4_ = auVar118._28_4_;
        auVar48._4_4_ = fVar211 * fVar132;
        auVar48._0_4_ = fVar208 * fVar126;
        auVar48._8_4_ = fVar213 * fVar133;
        auVar48._12_4_ = fVar215 * fVar134;
        auVar48._16_4_ = fVar217 * fVar135;
        auVar48._20_4_ = fVar219 * fVar136;
        auVar48._24_4_ = fVar221 * fVar137;
        auVar48._28_4_ = auVar148._28_4_;
        auVar49._4_4_ = fVar174 * fVar157;
        auVar49._0_4_ = fVar168 * fVar152;
        auVar49._8_4_ = fVar176 * fVar159;
        auVar49._12_4_ = fVar178 * fVar161;
        auVar49._16_4_ = fVar180 * fVar163;
        auVar49._20_4_ = fVar182 * fVar165;
        auVar49._24_4_ = fVar184 * fVar167;
        auVar49._28_4_ = auVar26._28_4_;
        auVar141 = vsubps_avx(auVar48,auVar49);
        auVar50._4_4_ = fVar157 * fVar80;
        auVar50._0_4_ = fVar152 * fVar169;
        auVar50._8_4_ = fVar159 * fVar82;
        auVar50._12_4_ = fVar161 * fVar83;
        auVar50._16_4_ = fVar163 * fVar84;
        auVar50._20_4_ = fVar165 * fVar85;
        auVar50._24_4_ = fVar167 * fVar151;
        auVar50._28_4_ = auVar75._28_4_;
        auVar118 = vsubps_avx(auVar50,auVar47);
        auVar148 = vandps_avx(auVar49,auVar142);
        auVar75 = vandps_avx(auVar47,auVar142);
        auVar75 = vcmpps_avx(auVar148,auVar75,1);
        local_10a0 = vblendvps_avx(auVar118,auVar141,auVar75);
        auVar51._4_4_ = fVar201 * fVar80;
        auVar51._0_4_ = fVar198 * fVar169;
        auVar51._8_4_ = fVar202 * fVar82;
        auVar51._12_4_ = fVar203 * fVar83;
        auVar51._16_4_ = fVar204 * fVar84;
        auVar51._20_4_ = fVar205 * fVar85;
        auVar51._24_4_ = fVar206 * fVar151;
        auVar51._28_4_ = auVar23._28_4_;
        auVar52._4_4_ = fVar174 * fVar201;
        auVar52._0_4_ = fVar168 * fVar198;
        auVar52._8_4_ = fVar176 * fVar202;
        auVar52._12_4_ = fVar178 * fVar203;
        auVar52._16_4_ = fVar180 * fVar204;
        auVar52._20_4_ = fVar182 * fVar205;
        auVar52._24_4_ = fVar184 * fVar206;
        auVar52._28_4_ = auVar75._28_4_;
        auVar53._4_4_ = fVar210 * fVar211;
        auVar53._0_4_ = fVar207 * fVar208;
        auVar53._8_4_ = fVar212 * fVar213;
        auVar53._12_4_ = fVar214 * fVar215;
        auVar53._16_4_ = fVar216 * fVar217;
        auVar53._20_4_ = fVar218 * fVar219;
        auVar53._24_4_ = fVar220 * fVar221;
        auVar53._28_4_ = auVar141._28_4_;
        auVar54._4_4_ = fVar211 * fVar175;
        auVar54._0_4_ = fVar208 * fVar170;
        auVar54._8_4_ = fVar213 * fVar177;
        auVar54._12_4_ = fVar215 * fVar179;
        auVar54._16_4_ = fVar217 * fVar181;
        auVar54._20_4_ = fVar219 * fVar183;
        auVar54._24_4_ = fVar221 * fVar185;
        auVar54._28_4_ = auVar148._28_4_;
        auVar141 = vsubps_avx(auVar52,auVar53);
        auVar118 = vsubps_avx(auVar54,auVar51);
        auVar148 = vandps_avx(auVar53,auVar142);
        auVar75 = vandps_avx(auVar51,auVar142);
        auVar75 = vcmpps_avx(auVar148,auVar75,1);
        local_1080 = vblendvps_avx(auVar118,auVar141,auVar75);
        fVar169 = local_10c0._0_4_ * local_1420._4_4_ +
                  local_10a0._0_4_ * (float)local_13c0._4_4_ + local_1080._0_4_ * fVar74;
        fVar80 = local_10c0._4_4_ * local_1420._4_4_ +
                 local_10a0._4_4_ * (float)local_13c0._4_4_ + local_1080._4_4_ * fVar74;
        fVar81 = local_10c0._8_4_ * local_1420._4_4_ +
                 local_10a0._8_4_ * (float)local_13c0._4_4_ + local_1080._8_4_ * fVar74;
        fVar82 = local_10c0._12_4_ * local_1420._4_4_ +
                 local_10a0._12_4_ * (float)local_13c0._4_4_ + local_1080._12_4_ * fVar74;
        fVar83 = local_10c0._16_4_ * local_1420._4_4_ +
                 local_10a0._16_4_ * (float)local_13c0._4_4_ + local_1080._16_4_ * fVar74;
        fVar84 = local_10c0._20_4_ * local_1420._4_4_ +
                 local_10a0._20_4_ * (float)local_13c0._4_4_ + local_1080._20_4_ * fVar74;
        fVar74 = local_10c0._24_4_ * local_1420._4_4_ +
                 local_10a0._24_4_ * (float)local_13c0._4_4_ + local_1080._24_4_ * fVar74;
        fVar85 = auVar148._28_4_ + auVar148._28_4_ + auVar141._28_4_;
        auVar87._0_4_ = fVar169 + fVar169;
        auVar87._4_4_ = fVar80 + fVar80;
        auVar87._8_4_ = fVar81 + fVar81;
        auVar87._12_4_ = fVar82 + fVar82;
        auVar87._16_4_ = fVar83 + fVar83;
        auVar87._20_4_ = fVar84 + fVar84;
        auVar87._24_4_ = fVar74 + fVar74;
        auVar87._28_4_ = fVar85 + fVar85;
        auVar148 = vrcpps_avx(auVar87);
        fVar169 = local_10c0._0_4_ * fVar9 + local_10a0._0_4_ * fVar7 + local_1080._0_4_ * fVar8;
        fVar80 = local_10c0._4_4_ * fVar12 + local_10a0._4_4_ * fVar10 + local_1080._4_4_ * fVar11;
        fVar98 = local_10c0._8_4_ * fVar100 + local_10a0._8_4_ * fVar98 + local_1080._8_4_ * fVar99;
        fVar99 = local_10c0._12_4_ * fVar13 +
                 local_10a0._12_4_ * fVar101 + local_1080._12_4_ * fVar103;
        fVar100 = local_10c0._16_4_ * fVar16 +
                  local_10a0._16_4_ * fVar14 + local_1080._16_4_ * fVar15;
        fVar101 = local_10c0._20_4_ * fVar19 +
                  local_10a0._20_4_ * fVar17 + local_1080._20_4_ * fVar18;
        fVar103 = local_10c0._24_4_ * fVar22 +
                  local_10a0._24_4_ * fVar20 + local_1080._24_4_ * fVar21;
        fVar74 = auVar148._0_4_;
        fVar7 = auVar148._4_4_;
        auVar55._4_4_ = auVar87._4_4_ * fVar7;
        auVar55._0_4_ = auVar87._0_4_ * fVar74;
        fVar8 = auVar148._8_4_;
        auVar55._8_4_ = auVar87._8_4_ * fVar8;
        fVar9 = auVar148._12_4_;
        auVar55._12_4_ = auVar87._12_4_ * fVar9;
        fVar10 = auVar148._16_4_;
        auVar55._16_4_ = auVar87._16_4_ * fVar10;
        fVar11 = auVar148._20_4_;
        auVar55._20_4_ = auVar87._20_4_ * fVar11;
        fVar12 = auVar148._24_4_;
        auVar55._24_4_ = auVar87._24_4_ * fVar12;
        auVar55._28_4_ = auVar118._28_4_;
        auVar131._8_4_ = 0x3f800000;
        auVar131._0_8_ = 0x3f8000003f800000;
        auVar131._12_4_ = 0x3f800000;
        auVar131._16_4_ = 0x3f800000;
        auVar131._20_4_ = 0x3f800000;
        auVar131._24_4_ = 0x3f800000;
        auVar131._28_4_ = 0x3f800000;
        auVar148 = vsubps_avx(auVar131,auVar55);
        uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
        auVar121._4_4_ = uVar1;
        auVar121._0_4_ = uVar1;
        auVar121._8_4_ = uVar1;
        auVar121._12_4_ = uVar1;
        auVar121._16_4_ = uVar1;
        auVar121._20_4_ = uVar1;
        auVar121._24_4_ = uVar1;
        auVar121._28_4_ = uVar1;
        local_10e0._4_4_ = (fVar80 + fVar80) * (fVar7 + fVar7 * auVar148._4_4_);
        local_10e0._0_4_ = (fVar169 + fVar169) * (fVar74 + fVar74 * auVar148._0_4_);
        local_10e0._8_4_ = (fVar98 + fVar98) * (fVar8 + fVar8 * auVar148._8_4_);
        local_10e0._12_4_ = (fVar99 + fVar99) * (fVar9 + fVar9 * auVar148._12_4_);
        local_10e0._16_4_ = (fVar100 + fVar100) * (fVar10 + fVar10 * auVar148._16_4_);
        local_10e0._20_4_ = (fVar101 + fVar101) * (fVar11 + fVar11 * auVar148._20_4_);
        local_10e0._24_4_ = (fVar103 + fVar103) * (fVar12 + fVar12 * auVar148._24_4_);
        local_10e0._28_4_ = local_1180._28_4_;
        auVar148 = vcmpps_avx(auVar121,local_10e0,2);
        fVar74 = (ray->super_RayK<1>).tfar;
        auVar108._4_4_ = fVar74;
        auVar108._0_4_ = fVar74;
        auVar108._8_4_ = fVar74;
        auVar108._12_4_ = fVar74;
        auVar108._16_4_ = fVar74;
        auVar108._20_4_ = fVar74;
        auVar108._24_4_ = fVar74;
        auVar108._28_4_ = fVar74;
        auVar75 = vcmpps_avx(local_10e0,auVar108,2);
        auVar148 = vandps_avx(auVar148,auVar75);
        auVar75 = vcmpps_avx(auVar87,_DAT_01f7b000,4);
        auVar148 = vandps_avx(auVar75,auVar148);
        auVar95 = vpslld_avx(auVar148._0_16_,0x1f);
        auVar96 = vpsrad_avx(auVar95,0x1f);
        auVar95 = vpslld_avx(auVar148._16_16_,0x1f);
        auVar95 = vpsrad_avx(auVar95,0x1f);
        auVar88._16_16_ = auVar95;
        auVar88._0_16_ = auVar96;
        auVar59._8_8_ = uStack_11d8;
        auVar59._0_8_ = local_11e0;
        auVar59._16_8_ = uStack_11d0;
        auVar59._24_8_ = uStack_11c8;
        auVar148 = vandps_avx(local_1040,auVar59);
        auVar75 = auVar148 & auVar88;
        if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar75 >> 0x7f,0) != '\0') ||
              (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar75 >> 0xbf,0) != '\0') ||
            (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar75[0x1f] < '\0') {
          uVar60 = *(uint *)(uVar69 + 0x18);
          uVar68 = CONCAT44(0,uVar60);
          local_134c = *(uint *)(uVar69 + 0x1c);
          auVar148 = vandps_avx(auVar88,auVar148);
          uVar61 = vextractps_avx(SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0),1);
          local_11c0._8_4_ = local_1380._8_4_;
          local_11c0._0_8_ = local_1380._0_8_;
          fStack_11b4 = local_1380._12_4_;
          fStack_11b0 = local_1380._16_4_;
          fStack_11ac = local_1380._20_4_;
          fStack_11a8 = local_1380._24_4_;
          fStack_11a4 = local_1380._28_4_;
          local_1160 = &local_1438;
          local_1140 = auVar148;
          pGVar63 = (context->scene->geometries).items[uVar68].ptr;
          if ((pGVar63->mask & uVar61) != 0) {
            local_12a0 = auVar148;
            auVar95 = *(undefined1 (*) [16])(*local_1438 + local_1430 * 4);
            auVar96 = auVar95;
            if (2 < local_1428) {
              auVar96 = *(undefined1 (*) [16])(*local_1438 + local_1430 * 8);
            }
            auVar75 = vrcpps_avx(local_1180);
            fVar74 = auVar75._0_4_;
            fVar7 = auVar75._4_4_;
            auVar56._4_4_ = local_1180._4_4_ * fVar7;
            auVar56._0_4_ = local_1180._0_4_ * fVar74;
            fVar8 = auVar75._8_4_;
            auVar56._8_4_ = local_1180._8_4_ * fVar8;
            fVar9 = auVar75._12_4_;
            auVar56._12_4_ = local_1180._12_4_ * fVar9;
            fVar10 = auVar75._16_4_;
            auVar56._16_4_ = local_1180._16_4_ * fVar10;
            fVar11 = auVar75._20_4_;
            auVar56._20_4_ = local_1180._20_4_ * fVar11;
            fVar12 = auVar75._24_4_;
            auVar56._24_4_ = local_1180._24_4_ * fVar12;
            auVar56._28_4_ = local_1380._28_4_;
            auVar122._8_4_ = 0x3f800000;
            auVar122._0_8_ = 0x3f8000003f800000;
            auVar122._12_4_ = 0x3f800000;
            auVar122._16_4_ = 0x3f800000;
            auVar122._20_4_ = 0x3f800000;
            auVar122._24_4_ = 0x3f800000;
            auVar122._28_4_ = 0x3f800000;
            auVar141 = vsubps_avx(auVar122,auVar56);
            auVar76._0_4_ = fVar74 + fVar74 * auVar141._0_4_;
            auVar76._4_4_ = fVar7 + fVar7 * auVar141._4_4_;
            auVar76._8_4_ = fVar8 + fVar8 * auVar141._8_4_;
            auVar76._12_4_ = fVar9 + fVar9 * auVar141._12_4_;
            auVar76._16_4_ = fVar10 + fVar10 * auVar141._16_4_;
            auVar76._20_4_ = fVar11 + fVar11 * auVar141._20_4_;
            auVar76._24_4_ = fVar12 + fVar12 * auVar141._24_4_;
            auVar76._28_4_ = auVar75._28_4_ + auVar141._28_4_;
            auVar89._8_4_ = 0x219392ef;
            auVar89._0_8_ = 0x219392ef219392ef;
            auVar89._12_4_ = 0x219392ef;
            auVar89._16_4_ = 0x219392ef;
            auVar89._20_4_ = 0x219392ef;
            auVar89._24_4_ = 0x219392ef;
            auVar89._28_4_ = 0x219392ef;
            auVar75 = vcmpps_avx(local_1060,auVar89,5);
            auVar75 = vandps_avx(auVar75,auVar76);
            auVar57._4_4_ = auVar75._4_4_ * fVar191;
            auVar57._0_4_ = auVar75._0_4_ * fVar187;
            auVar57._8_4_ = auVar75._8_4_ * local_1380._8_4_;
            auVar57._12_4_ = auVar75._12_4_ * local_1380._12_4_;
            auVar57._16_4_ = auVar75._16_4_ * local_1380._16_4_;
            auVar57._20_4_ = auVar75._20_4_ * local_1380._20_4_;
            auVar57._24_4_ = auVar75._24_4_ * local_1380._24_4_;
            auVar57._28_4_ = auVar76._28_4_;
            auVar141 = vminps_avx(auVar57,auVar122);
            auVar58._4_4_ = local_11a0._4_4_ * auVar75._4_4_;
            auVar58._0_4_ = local_11a0._0_4_ * auVar75._0_4_;
            auVar58._8_4_ = local_11a0._8_4_ * auVar75._8_4_;
            auVar58._12_4_ = local_11a0._12_4_ * auVar75._12_4_;
            auVar58._16_4_ = local_11a0._16_4_ * auVar75._16_4_;
            auVar58._20_4_ = local_11a0._20_4_ * auVar75._20_4_;
            auVar58._24_4_ = local_11a0._24_4_ * auVar75._24_4_;
            auVar58._28_4_ = auVar75._28_4_;
            auVar75 = vminps_avx(auVar58,auVar122);
            auVar147 = *local_1438;
            if (local_1430 == 2) {
              auVar147 = vpshufd_avx(auVar147,0x54);
              auVar95 = vpshufd_avx(auVar95,0x54);
              auVar96 = vpshufd_avx(auVar96,0x54);
            }
            auVar123._16_16_ = auVar95;
            auVar123._0_16_ = auVar147;
            auVar143._16_16_ = auVar96;
            auVar143._0_16_ = auVar95;
            auVar28 = vunpcklps_avx(auVar123,auVar143);
            auVar147 = vpshufd_avx(auVar147,0xa5);
            auVar91 = vpshufd_avx(auVar95,0xa5);
            auVar139._0_16_ = vpsrld_avx(auVar28._0_16_,0x10);
            auVar153 = vpsrld_avx(auVar28._16_16_,0x10);
            auVar139._16_16_ = auVar153;
            auVar154._16_16_ = auVar91;
            auVar154._0_16_ = auVar147;
            auVar95 = vpshufd_avx(auVar95,0x94);
            auVar96 = vpshufd_avx(auVar96,0x94);
            auVar144._0_16_ = vpsrld_avx(auVar147,0x10);
            auVar147 = vpsrld_avx(auVar91,0x10);
            auVar144._16_16_ = auVar147;
            auVar149._16_16_ = auVar96;
            auVar149._0_16_ = auVar95;
            auVar109._0_16_ = vpsrld_avx(auVar95,0x10);
            auVar95 = vpsrld_avx(auVar96,0x10);
            auVar109._16_16_ = auVar95;
            auVar172._8_4_ = 0xffff;
            auVar172._0_8_ = 0xffff0000ffff;
            auVar172._12_4_ = 0xffff;
            auVar172._16_4_ = 0xffff;
            auVar172._20_4_ = 0xffff;
            auVar172._24_4_ = 0xffff;
            auVar172._28_4_ = 0xffff;
            auVar118 = vandps_avx(auVar154,auVar172);
            auVar26 = vcvtdq2ps_avx(auVar118);
            auVar118 = vandps_avx(auVar149,auVar172);
            auVar27 = vcvtdq2ps_avx(auVar118);
            auVar23 = vcvtdq2ps_avx(auVar144);
            auVar24 = vcvtdq2ps_avx(auVar109);
            auVar145._8_4_ = 0x3f800000;
            auVar145._0_8_ = 0x3f8000003f800000;
            auVar145._12_4_ = 0x3f800000;
            auVar145._16_4_ = 0x3f800000;
            auVar145._20_4_ = 0x3f800000;
            auVar145._24_4_ = 0x3f800000;
            auVar145._28_4_ = 0x3f800000;
            auVar118 = vsubps_avx(auVar145,auVar141);
            auVar25 = vsubps_avx(auVar118,auVar75);
            auVar118 = vandps_avx(auVar172,auVar28);
            auVar118 = vcvtdq2ps_avx(auVar118);
            auVar28 = vcvtdq2ps_avx(auVar139);
            local_1120[0] =
                 auVar27._0_4_ * 0.00012207031 * auVar75._0_4_ +
                 auVar141._0_4_ * auVar26._0_4_ * 0.00012207031 +
                 auVar25._0_4_ * auVar118._0_4_ * 0.00012207031;
            local_1120[1] =
                 auVar27._4_4_ * 0.00012207031 * auVar75._4_4_ +
                 auVar141._4_4_ * auVar26._4_4_ * 0.00012207031 +
                 auVar25._4_4_ * auVar118._4_4_ * 0.00012207031;
            local_1120[2] =
                 auVar27._8_4_ * 0.00012207031 * auVar75._8_4_ +
                 auVar141._8_4_ * auVar26._8_4_ * 0.00012207031 +
                 auVar25._8_4_ * auVar118._8_4_ * 0.00012207031;
            local_1120[3] =
                 auVar27._12_4_ * 0.00012207031 * auVar75._12_4_ +
                 auVar141._12_4_ * auVar26._12_4_ * 0.00012207031 +
                 auVar25._12_4_ * auVar118._12_4_ * 0.00012207031;
            fStack_1110 = auVar27._16_4_ * 0.00012207031 * auVar75._16_4_ +
                          auVar141._16_4_ * auVar26._16_4_ * 0.00012207031 +
                          auVar25._16_4_ * auVar118._16_4_ * 0.00012207031;
            fStack_110c = auVar27._20_4_ * 0.00012207031 * auVar75._20_4_ +
                          auVar141._20_4_ * auVar26._20_4_ * 0.00012207031 +
                          auVar25._20_4_ * auVar118._20_4_ * 0.00012207031;
            fStack_1108 = auVar27._24_4_ * 0.00012207031 * auVar75._24_4_ +
                          auVar141._24_4_ * auVar26._24_4_ * 0.00012207031 +
                          auVar25._24_4_ * auVar118._24_4_ * 0.00012207031;
            fStack_1104 = auVar27._28_4_ + auVar26._28_4_ + auVar118._28_4_;
            local_1100[0] =
                 auVar75._0_4_ * auVar24._0_4_ * 0.00012207031 +
                 auVar141._0_4_ * auVar23._0_4_ * 0.00012207031 +
                 auVar25._0_4_ * auVar28._0_4_ * 0.00012207031;
            local_1100[1] =
                 auVar75._4_4_ * auVar24._4_4_ * 0.00012207031 +
                 auVar141._4_4_ * auVar23._4_4_ * 0.00012207031 +
                 auVar25._4_4_ * auVar28._4_4_ * 0.00012207031;
            local_1100[2] =
                 auVar75._8_4_ * auVar24._8_4_ * 0.00012207031 +
                 auVar141._8_4_ * auVar23._8_4_ * 0.00012207031 +
                 auVar25._8_4_ * auVar28._8_4_ * 0.00012207031;
            local_1100[3] =
                 auVar75._12_4_ * auVar24._12_4_ * 0.00012207031 +
                 auVar141._12_4_ * auVar23._12_4_ * 0.00012207031 +
                 auVar25._12_4_ * auVar28._12_4_ * 0.00012207031;
            fStack_10f0 = auVar75._16_4_ * auVar24._16_4_ * 0.00012207031 +
                          auVar141._16_4_ * auVar23._16_4_ * 0.00012207031 +
                          auVar25._16_4_ * auVar28._16_4_ * 0.00012207031;
            fStack_10ec = auVar75._20_4_ * auVar24._20_4_ * 0.00012207031 +
                          auVar141._20_4_ * auVar23._20_4_ * 0.00012207031 +
                          auVar25._20_4_ * auVar28._20_4_ * 0.00012207031;
            fStack_10e8 = auVar75._24_4_ * auVar24._24_4_ * 0.00012207031 +
                          auVar141._24_4_ * auVar23._24_4_ * 0.00012207031 +
                          auVar25._24_4_ * auVar28._24_4_ * 0.00012207031;
            fStack_10e4 = auVar24._28_4_ + auVar23._28_4_ + auVar25._28_4_;
            auVar77._8_4_ = 0x7f800000;
            auVar77._0_8_ = 0x7f8000007f800000;
            auVar77._12_4_ = 0x7f800000;
            auVar77._16_4_ = 0x7f800000;
            auVar77._20_4_ = 0x7f800000;
            auVar77._24_4_ = 0x7f800000;
            auVar77._28_4_ = 0x7f800000;
            auVar75 = vblendvps_avx(auVar77,local_10e0,auVar148);
            auVar141 = vshufps_avx(auVar75,auVar75,0xb1);
            auVar141 = vminps_avx(auVar75,auVar141);
            auVar118 = vshufpd_avx(auVar141,auVar141,5);
            auVar141 = vminps_avx(auVar141,auVar118);
            auVar118 = vperm2f128_avx(auVar141,auVar141,1);
            auVar141 = vminps_avx(auVar141,auVar118);
            auVar75 = vcmpps_avx(auVar75,auVar141,0);
            auVar141 = auVar148 & auVar75;
            if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar141 >> 0x7f,0) != '\0') ||
                  (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar141 >> 0xbf,0) != '\0') ||
                (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar141[0x1f] < '\0') {
              auVar148 = vandps_avx(auVar75,auVar148);
            }
            uVar62 = vmovmskps_avx(auVar148);
            uVar61 = 0;
            if (uVar62 != 0) {
              for (; (uVar62 >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
              }
            }
            uVar67 = (ulong)uVar61;
            local_13a0._0_8_ = context->args;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar63->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_12c0 = local_10e0;
              local_12e0._0_8_ = context->user;
              _local_13c0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_1300._0_8_ = uVar68;
              local_1320._0_4_ = local_134c;
              local_1420 = pGVar63;
              do {
                local_1354 = local_1120[uVar67];
                local_1350 = local_1100[uVar67];
                (ray->super_RayK<1>).tfar = *(float *)(local_10e0 + uVar67 * 4);
                local_1380._0_8_ = uVar67;
                local_1360 = *(float *)(local_10c0 + uVar67 * 4);
                local_135c = *(undefined4 *)(local_10a0 + uVar67 * 4);
                local_1358 = *(undefined4 *)(local_1080 + uVar67 * 4);
                local_1348 = (int)uVar68;
                local_1344 = *(uint *)local_12e0._0_8_;
                local_1340 = *(uint *)(local_12e0._0_8_ + 4);
                local_144c = -1;
                local_13f0.valid = &local_144c;
                local_13f0.geometryUserPtr = pGVar63->userPtr;
                local_13f0.context = (RTCRayQueryContext *)local_12e0._0_8_;
                local_13f0.ray = (RTCRayN *)ray;
                local_13f0.hit = (RTCHitN *)&local_1360;
                local_13f0.N = 1;
                uVar60 = local_134c;
                if (pGVar63->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b7fd54:
                  if ((*(code **)(local_13a0._0_8_ + 0x10) != (code *)0x0) &&
                     (((*(byte *)local_13a0._0_8_ & 2) != 0 ||
                      ((*(byte *)((long)local_1420 + 0x3e) & 0x40) != 0)))) {
                    (**(code **)(local_13a0._0_8_ + 0x10))(&local_13f0);
                    ray = local_1440;
                    uVar68 = local_1300._0_8_;
                    uVar70 = local_1448;
                    uVar60 = local_1320._0_4_;
                    if (*local_13f0.valid == 0) goto LAB_00b7fe16;
                  }
                  (((Vec3f *)((long)local_13f0.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_13f0.hit;
                  (((Vec3f *)((long)local_13f0.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_13f0.hit + 4);
                  (((Vec3f *)((long)local_13f0.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_13f0.hit + 8);
                  *(float *)((long)local_13f0.ray + 0x3c) = *(float *)(local_13f0.hit + 0xc);
                  *(float *)((long)local_13f0.ray + 0x40) = *(float *)(local_13f0.hit + 0x10);
                  *(float *)((long)local_13f0.ray + 0x44) = *(float *)(local_13f0.hit + 0x14);
                  *(float *)((long)local_13f0.ray + 0x48) = *(float *)(local_13f0.hit + 0x18);
                  *(float *)((long)local_13f0.ray + 0x4c) = *(float *)(local_13f0.hit + 0x1c);
                  *(float *)((long)local_13f0.ray + 0x50) = *(float *)(local_13f0.hit + 0x20);
                  local_134c = uVar60;
                }
                else {
                  (*pGVar63->intersectionFilterN)(&local_13f0);
                  ray = local_1440;
                  uVar68 = local_1300._0_8_;
                  uVar70 = local_1448;
                  uVar60 = local_1320._0_4_;
                  if (*local_13f0.valid != 0) goto LAB_00b7fd54;
LAB_00b7fe16:
                  (local_1440->super_RayK<1>).tfar = (float)local_13c0._0_4_;
                  ray = local_1440;
                  uVar68 = local_1300._0_8_;
                  uVar70 = local_1448;
                  local_134c = local_1320._0_4_;
                }
                *(undefined4 *)(local_12a0 + local_1380._0_8_ * 4) = 0;
                auVar141 = local_12a0;
                fVar74 = (ray->super_RayK<1>).tfar;
                auVar78._4_4_ = fVar74;
                auVar78._0_4_ = fVar74;
                auVar78._8_4_ = fVar74;
                auVar78._12_4_ = fVar74;
                auVar78._16_4_ = fVar74;
                auVar78._20_4_ = fVar74;
                auVar78._24_4_ = fVar74;
                auVar78._28_4_ = fVar74;
                auVar75 = vcmpps_avx(local_12c0,auVar78,2);
                auVar148 = vandps_avx(auVar75,local_12a0);
                local_12a0 = auVar148;
                auVar141 = auVar141 & auVar75;
                if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar141 >> 0x7f,0) == '\0') &&
                      (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar141 >> 0xbf,0) == '\0') &&
                    (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar141[0x1f]) goto LAB_00b7fb83;
                auVar90._8_4_ = 0x7f800000;
                auVar90._0_8_ = 0x7f8000007f800000;
                auVar90._12_4_ = 0x7f800000;
                auVar90._16_4_ = 0x7f800000;
                auVar90._20_4_ = 0x7f800000;
                auVar90._24_4_ = 0x7f800000;
                auVar90._28_4_ = 0x7f800000;
                auVar75 = vblendvps_avx(auVar90,local_12c0,auVar148);
                auVar141 = vshufps_avx(auVar75,auVar75,0xb1);
                auVar141 = vminps_avx(auVar75,auVar141);
                auVar118 = vshufpd_avx(auVar141,auVar141,5);
                auVar141 = vminps_avx(auVar141,auVar118);
                auVar118 = vperm2f128_avx(auVar141,auVar141,1);
                auVar141 = vminps_avx(auVar141,auVar118);
                auVar75 = vcmpps_avx(auVar75,auVar141,0);
                auVar141 = auVar148 & auVar75;
                if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar141 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar141 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar141 >> 0x7f,0) != '\0') ||
                      (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar141 >> 0xbf,0) != '\0') ||
                    (auVar141 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar141[0x1f] < '\0') {
                  auVar148 = vandps_avx(auVar75,auVar148);
                }
                _local_13c0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar61 = vmovmskps_avx(auVar148);
                uVar60 = 0;
                if (uVar61 != 0) {
                  for (; (uVar61 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                  }
                }
                uVar67 = (ulong)uVar60;
                pGVar63 = local_1420;
              } while( true );
            }
            fVar74 = local_1120[uVar67];
            fVar7 = local_1100[uVar67];
            fVar8 = *(float *)(local_10c0 + uVar67 * 4);
            fVar9 = *(float *)(local_10a0 + uVar67 * 4);
            fVar10 = *(float *)(local_1080 + uVar67 * 4);
            (ray->super_RayK<1>).tfar = *(float *)(local_10e0 + uVar67 * 4);
            (ray->Ng).field_0.field_0.x = fVar8;
            (ray->Ng).field_0.field_0.y = fVar9;
            (ray->Ng).field_0.field_0.z = fVar10;
            ray->u = fVar74;
            ray->v = fVar7;
            ray->primID = local_134c;
            ray->geomID = uVar60;
            pRVar5 = context->user;
            ray->instID[0] = pRVar5->instID[0];
            ray->instPrimID[0] = pRVar5->instPrimID[0];
          }
        }
      }
LAB_00b7fb83:
      fVar74 = (ray->super_RayK<1>).tfar;
      auVar79 = ZEXT1664(CONCAT412(fVar74,CONCAT48(fVar74,CONCAT44(fVar74,fVar74))));
      auVar146 = ZEXT1664(local_11f0);
      auVar150 = ZEXT1664(local_1200);
      auVar155 = ZEXT1664(local_1210);
      auVar173 = ZEXT1664(local_1220);
      auVar189 = ZEXT1664(local_1230);
      auVar197 = ZEXT1664(local_1240);
      auVar200 = ZEXT1664(local_1250);
      auVar209 = ZEXT1664(local_1260);
      auVar222 = ZEXT1664(local_1270);
      auVar140 = ZEXT1664(local_1330);
      goto LAB_00b7f0d8;
    }
    uVar69 = uVar68 & 0xfffffffffffffff0;
    lVar6 = *(long *)(uVar69 + 0x30 + (ulong)*(uint *)(uVar69 + 0x2c));
    fVar74 = (ray->super_RayK<1>).tfar;
    auVar79 = ZEXT1664(CONCAT412(fVar74,CONCAT48(fVar74,CONCAT44(fVar74,fVar74))));
    if (lVar6 != 0) {
      *(long *)*pauVar71 = lVar6;
      *(undefined4 *)(*pauVar71 + 8) = 0;
      pauVar71 = pauVar71 + 1;
    }
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }